

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall kratos::Generator::clear_remove_stmt_cache(Generator *this)

{
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_48;
  const_iterator local_40;
  Generator *local_38;
  shared_ptr<kratos::Stmt> *local_30;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_20;
  const_iterator local_18;
  Generator *local_10;
  Generator *this_local;
  
  local_10 = this;
  local_28._M_current =
       (shared_ptr<kratos::Stmt> *)
       std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
       begin(&this->stmts_);
  local_30 = (shared_ptr<kratos::Stmt> *)
             std::
             vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ::end(&this->stmts_);
  local_38 = this;
  local_20 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,kratos::Generator::clear_remove_stmt_cache()::__0>
                       (local_28,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                  )local_30,(anon_class_8_1_8991fb9c_for__M_pred)this);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<kratos::Stmt>const*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>
  ::__normal_iterator<std::shared_ptr<kratos::Stmt>*>
            ((__normal_iterator<std::shared_ptr<kratos::Stmt>const*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>
              *)&local_18,&local_20);
  local_48._M_current =
       (shared_ptr<kratos::Stmt> *)
       std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
       end(&this->stmts_);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<kratos::Stmt>const*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>
  ::__normal_iterator<std::shared_ptr<kratos::Stmt>*>
            ((__normal_iterator<std::shared_ptr<kratos::Stmt>const*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>
              *)&local_40,&local_48);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::erase
            (&this->stmts_,local_18,local_40);
  std::
  unordered_set<std::shared_ptr<kratos::Stmt>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ::clear(&this->stmts_remove_cache_);
  return;
}

Assistant:

void Generator::clear_remove_stmt_cache() {
    stmts_.erase(std::remove_if(stmts_.begin(), stmts_.end(),
                                [this](auto const &stmt) {
                                    return stmts_remove_cache_.find(stmt) !=
                                           stmts_remove_cache_.end();
                                }),
                 stmts_.end());

    stmts_remove_cache_.clear();
}